

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageAndSubImageTest::
LoopTestOverS<unsigned_char,false,3u,false>(StorageAndSubImageTest *this,bool skip_rgb)

{
  bool bVar1;
  GLchar *variable_declaration;
  GLchar *tail;
  undefined1 local_12;
  bool result;
  bool skip_rgb_local;
  StorageAndSubImageTest *this_local;
  
  variable_declaration = FragmentShaderDeclaration<unsigned_char,false,3u>();
  tail = FragmentShaderTail<3u>();
  PrepareProgram(this,variable_declaration,tail);
  local_12 = Test<unsigned_char,1,false,3u,false>(this);
  bVar1 = Test<unsigned_char,2,false,3u,false>(this);
  local_12 = local_12 && bVar1;
  if (!skip_rgb) {
    bVar1 = Test<unsigned_char,3,false,3u,false>(this);
    local_12 = local_12 && bVar1;
  }
  bVar1 = Test<unsigned_char,4,false,3u,false>(this);
  CleanProgram(this);
  CleanErrors(this);
  return (local_12 & bVar1) != 0;
}

Assistant:

bool StorageAndSubImageTest::LoopTestOverS(bool skip_rgb)
{
	/* Prepare one program per test loop. */
	PrepareProgram(FragmentShaderDeclaration<T, N, D>(), FragmentShaderTail<D>());

	/* Run tests. */
	bool result = true;

	result &= Test<T, 1, N, D, I>();

	result &= Test<T, 2, N, D, I>();

	if (!skip_rgb)
	{
		result &= Test<T, 3, N, D, I>();
	}

	result &= Test<T, 4, N, D, I>();

	/* Cleanup.*/
	CleanProgram();
	CleanErrors();

	/* Pass result. */
	return result;
}